

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

void __thiscall
de::BlockBuffer<unsigned_char>::BlockBuffer
          (BlockBuffer<unsigned_char> *this,int blockSize,int numBlocks)

{
  undefined1 auVar1 [16];
  uchar *puVar2;
  ulong uVar3;
  int *piVar4;
  deSemaphore dVar5;
  int numBlocks_local;
  int blockSize_local;
  BlockBuffer<unsigned_char> *this_local;
  
  this->m_fill = 0;
  this->m_empty = 0;
  this->m_writeBlock = 0;
  this->m_writePos = 0;
  this->m_readBlock = 0;
  this->m_readPos = 0;
  this->m_blockSize = blockSize;
  this->m_numBlocks = numBlocks;
  this->m_elements = (uchar *)0x0;
  this->m_numUsedInBlock = (int *)0x0;
  Mutex::Mutex(&this->m_writeLock,0);
  Mutex::Mutex(&this->m_readLock,0);
  this->m_canceled = 0;
  puVar2 = (uchar *)operator_new__((long)(this->m_numBlocks * this->m_blockSize));
  this->m_elements = puVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->m_numBlocks;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar3);
  this->m_numUsedInBlock = piVar4;
  dVar5 = deSemaphore_create(0,(deSemaphoreAttributes *)0x0);
  this->m_fill = dVar5;
  dVar5 = deSemaphore_create(numBlocks,(deSemaphoreAttributes *)0x0);
  this->m_empty = dVar5;
  return;
}

Assistant:

BlockBuffer<T>::BlockBuffer (int blockSize, int numBlocks)
	: m_fill			(0)
	, m_empty			(0)
	, m_writeBlock		(0)
	, m_writePos		(0)
	, m_readBlock		(0)
	, m_readPos			(0)
	, m_blockSize		(blockSize)
	, m_numBlocks		(numBlocks)
	, m_elements		(DE_NULL)
	, m_numUsedInBlock	(DE_NULL)
	, m_writeLock		()
	, m_readLock		()
	, m_canceled		(DE_FALSE)
{
	DE_ASSERT(blockSize > 0);
	DE_ASSERT(numBlocks > 0);

	try
	{
		m_elements			= new T[m_numBlocks*m_blockSize];
		m_numUsedInBlock	= new int[m_numBlocks];
	}
	catch (...)
	{
		delete[] m_elements;
		delete[] m_numUsedInBlock;
		throw;
	}

	m_fill	= deSemaphore_create(0, DE_NULL);
	m_empty	= deSemaphore_create(numBlocks, DE_NULL);
	DE_ASSERT(m_fill && m_empty);
}